

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O0

void __thiscall RefTable::Mark(RefTable *this,SQCollectable_conflict **chain)

{
  SQCollectable_conflict **in_RDI;
  SQUnsignedInteger n;
  RefNode *nodes;
  SQCollectable_conflict *o;
  SQCollectable_conflict *local_18;
  
  local_18 = in_RDI[2];
  for (o = (SQCollectable_conflict *)0x0; o < *in_RDI;
      o = (SQCollectable_conflict *)((long)&(o->super_SQRefCounted)._vptr_SQRefCounted + 1)) {
    if (*(int *)&(local_18->super_SQRefCounted)._vptr_SQRefCounted != 0x1000001) {
      SQSharedState::MarkObject((SQObjectPtr *)o,in_RDI);
    }
    local_18 = (SQCollectable_conflict *)&local_18->_prev;
  }
  return;
}

Assistant:

void RefTable::Mark(SQCollectable **chain)
{
    RefNode *nodes = (RefNode *)_nodes;
    for(SQUnsignedInteger n = 0; n < _numofslots; n++) {
        if(sq_type(nodes->obj) != OT_NULL) {
            SQSharedState::MarkObject(nodes->obj,chain);
        }
        nodes++;
    }
}